

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_list.cpp
# Opt level: O3

RK_S32 __thiscall mpp_list::del_by_key(mpp_list *this,void *data,RK_S32 size,RK_U32 key)

{
  mpp_list_node *pmVar1;
  mpp_list_node *__ptr;
  mpp_list_node *pmVar2;
  
  pmVar1 = this->head;
  if (pmVar1 == (mpp_list_node *)0x0) {
    return 0;
  }
  if (this->count == 0) {
    return 0;
  }
  __ptr = pmVar1->next;
  pmVar2 = __ptr->next;
  if (pmVar2 == pmVar1) {
    return -0x16;
  }
  pmVar1 = __ptr->prev;
  pmVar2->prev = pmVar1;
  pmVar1->next = pmVar2;
  __ptr->next = __ptr;
  __ptr->prev = __ptr;
  if (__ptr->size == size) {
    if (data == (void *)0x0) goto LAB_001197e3;
  }
  else {
    _mpp_log_l(2,"mpp_list","node size check failed when release_list",(char *)0x0);
    if (data == (void *)0x0) goto LAB_001197e3;
    if (__ptr->size < size) {
      size = __ptr->size;
    }
  }
  memcpy(data,__ptr + 1,(long)size);
LAB_001197e3:
  free(__ptr);
  this->count = this->count + -1;
  return -0x16;
}

Assistant:

RK_S32 mpp_list::del_by_key(void *data, RK_S32 size, RK_U32 key)
{
    RK_S32 ret = 0;
    if (head && count) {
        struct mpp_list_node *tmp = head->next;
        ret = -EINVAL;
        while (tmp->next != head) {
            if (tmp->key == key) {
                _list_del_node_no_lock(tmp, data, size);
                count--;
                break;
            }
        }
    }
    return ret;
}